

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryBuilder::getResizableLimits
          (WasmBinaryBuilder *this,Address *initial,Address *max,bool *shared,Type *indexType,
          Address defaultIfNoMax)

{
  uint32_t uVar1;
  BasicType id;
  uint64_t local_a0;
  uint64_t local_90;
  Type local_80 [3];
  allocator<char> local_61;
  string local_60;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  uint32_t local_3c;
  bool is64;
  bool isShared;
  bool hasMax;
  Type *pTStack_38;
  uint32_t flags;
  Type *indexType_local;
  bool *shared_local;
  Address *max_local;
  Address *initial_local;
  WasmBinaryBuilder *this_local;
  Address defaultIfNoMax_local;
  
  pTStack_38 = indexType;
  indexType_local = (Type *)shared;
  shared_local = (bool *)max;
  max_local = initial;
  initial_local = (Address *)this;
  this_local = (WasmBinaryBuilder *)defaultIfNoMax.addr;
  local_3c = getU32LEB(this);
  local_3d = (local_3c & 1) != 0;
  local_3e = (local_3c & 2) != 0;
  local_3f = (local_3c & 4) != 0;
  if ((bool)local_3f) {
    local_90 = getU64LEB(this);
  }
  else {
    uVar1 = getU32LEB(this);
    local_90 = (uint64_t)uVar1;
  }
  wasm::Address::operator=(max_local,local_90);
  if (((local_3e & 1) != 0) && ((local_3d & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"shared memory must have max size",&local_61);
    throwError(this,&local_60);
  }
  *(byte *)&indexType_local->id = local_3e & 1;
  id = i32;
  if ((local_3f & 1) != 0) {
    id = i64;
  }
  wasm::Type::Type(local_80,id);
  pTStack_38->id = local_80[0].id;
  if ((local_3d & 1) == 0) {
    *(WasmBinaryBuilder **)shared_local = this_local;
  }
  else {
    if ((local_3f & 1) == 0) {
      uVar1 = getU32LEB(this);
      local_a0 = (uint64_t)uVar1;
    }
    else {
      local_a0 = getU64LEB(this);
    }
    wasm::Address::operator=((Address *)shared_local,local_a0);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::getResizableLimits(Address& initial,
                                           Address& max,
                                           bool& shared,
                                           Type& indexType,
                                           Address defaultIfNoMax) {
  auto flags = getU32LEB();
  bool hasMax = (flags & BinaryConsts::HasMaximum) != 0;
  bool isShared = (flags & BinaryConsts::IsShared) != 0;
  bool is64 = (flags & BinaryConsts::Is64) != 0;
  initial = is64 ? getU64LEB() : getU32LEB();
  if (isShared && !hasMax) {
    throwError("shared memory must have max size");
  }
  shared = isShared;
  indexType = is64 ? Type::i64 : Type::i32;
  if (hasMax) {
    max = is64 ? getU64LEB() : getU32LEB();
  } else {
    max = defaultIfNoMax;
  }
}